

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

csubstr __thiscall
c4::yml::Parser::_filter_block_scalar
          (Parser *this,substr s,BlockStyle_e style,BlockChomp_e chomp,size_t indentation)

{
  char *pcVar1;
  char cVar2;
  code *pcVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  Location LVar9;
  Location LVar10;
  Location LVar11;
  Location LVar12;
  Location LVar13;
  Location LVar14;
  Location LVar15;
  Location LVar16;
  Location LVar17;
  Location LVar18;
  Location LVar19;
  csubstr cVar20;
  csubstr cVar21;
  csubstr cVar22;
  csubstr cVar23;
  csubstr cVar24;
  csubstr cVar25;
  char *pcVar26;
  BlockChomp_e chomp_00;
  bool bVar27;
  bool bVar28;
  char *pcVar29;
  Parser *pPVar30;
  char *pcVar31;
  size_t sVar32;
  char *pcVar33;
  char *pcVar34;
  undefined7 uVar35;
  Parser *pPVar36;
  long lVar37;
  char *pcVar38;
  long lVar39;
  Parser *num_characters;
  char *pcVar40;
  long lVar41;
  basic_substring<char> bVar42;
  csubstr cVar43;
  substr sVar44;
  csubstr cVar45;
  ro_substr chars;
  ro_substr chars_00;
  csubstr fmt;
  substr dst;
  char msg [32];
  csubstr rem;
  basic_substring<char> local_358;
  Parser *local_348;
  uint local_33c;
  char *local_338;
  BlockChomp_e local_330;
  uint local_32c;
  basic_substring<char> local_328;
  undefined5 uStack_318;
  undefined3 uStack_313;
  undefined2 uStack_310;
  undefined4 uStack_30e;
  undefined1 uStack_30a;
  undefined1 uStack_309;
  undefined2 uStack_308;
  undefined4 uStack_306;
  undefined1 uStack_302;
  undefined1 uStack_301;
  undefined2 uStack_300;
  undefined4 uStack_2fe;
  undefined1 uStack_2fa;
  undefined1 uStack_2f9;
  undefined6 uStack_2f8;
  char *local_2f0;
  basic_substring<char> local_2e8;
  basic_substring<const_char> local_2d8;
  long local_2c8;
  size_t local_2c0;
  long local_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  char *pcStack_298;
  undefined8 local_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  char *pcStack_270;
  undefined8 local_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  char *pcStack_248;
  undefined8 local_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  char *pcStack_220;
  undefined8 local_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  char *pcStack_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  char *pcStack_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  char *pcStack_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  char *pcStack_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  char *pcStack_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  char *pcStack_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  char *pcStack_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  char *pcStack_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  char *pcStack_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  char *pcStack_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  char *pcStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  local_2e8.len = s.len;
  local_2e8.str = s.str;
  if (chomp != CHOMP_KEEP) {
    chars.len = 3;
    chars.str = " \n\r";
    bVar42 = basic_substring<char>::triml(&local_2e8,chars);
    local_328.str = bVar42.str;
    local_328.len._0_5_ = (undefined5)bVar42.len;
    local_328.len._5_3_ = bVar42.len._5_3_;
    chars_00.len = 3;
    chars_00.str = " \n\r";
    bVar42 = basic_substring<char>::trimr(&local_328,chars_00);
    if (bVar42.len == 0) {
      cVar43.len = 0;
      cVar43.str = local_2e8.str;
      return cVar43;
    }
  }
  local_358.str = local_2e8.str;
  local_358.len = local_2e8.len;
  local_348 = this;
  local_2f0 = (char *)indentation;
  if (style == BLOCK_FOLD) {
    pPVar36 = (Parser *)(local_2e8.len + 2);
    pPVar30 = (Parser *)(this->m_filter_arena).len;
    if (pPVar30 < pPVar36) {
      pPVar30 = (Parser *)((long)pPVar30 * 2);
      if (pPVar30 <= pPVar36) {
        pPVar30 = pPVar36;
      }
      num_characters = (Parser *)&DAT_00000080;
      if ((Parser *)&DAT_00000080 < pPVar30) {
        num_characters = pPVar30;
      }
      _resize_filter_arena(this,(size_t)num_characters);
    }
    local_338 = (char *)0x0;
    pcVar38 = (char *)basic_substring<char>::first_not_of(&local_358,' ',0);
    pcVar29 = (char *)indentation;
    if (pcVar38 < indentation) {
      pcVar29 = pcVar38;
    }
    if (pcVar29 < local_358.len) {
      local_32c = (uint)CONCAT71((int7)((ulong)pcVar38 >> 8),indentation < pcVar38);
      bVar27 = false;
      local_33c = 0;
      pcVar38 = (char *)0x0;
      local_330 = chomp;
      do {
        cVar2 = (pcVar29 + -0x38)
                [(long)((stack<c4::yml::Parser::State,_16UL> *)((long)local_358.str + 0x38))->m_buf]
        ;
        if (cVar2 == '\t') {
LAB_001e166e:
          pPVar36 = (Parser *)(this->m_filter_arena).str;
          (pcVar38 + -0x38)[(long)(pPVar36->m_stack).m_buf] = cVar2;
          pcVar38 = pcVar38 + 1;
        }
        else if (cVar2 != '\r') {
          if (cVar2 != '\n') {
            local_33c = (uint)CONCAT71((int7)((ulong)pPVar36 >> 8),1);
            goto LAB_001e166e;
          }
          lVar41 = 1;
          local_2c8 = 0;
          lVar37 = -1;
LAB_001e1352:
          if (local_358.len <= pcVar29) {
            if ((((byte)s_error_flags & 1) != 0) && (bVar27 = is_debugger_attached(), bVar27)) {
              pcVar3 = (code *)swi(3);
              cVar43 = (csubstr)(*pcVar3)();
              return cVar43;
            }
            handle_error(0x1f7f77,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x14c3,"i >= 0 && i < len");
          }
          lVar39 = lVar37;
          this = local_348;
          if ((pcVar29 + -0x38)
              [(long)((stack<c4::yml::Parser::State,_16UL> *)((long)local_358.str + 0x38))->m_buf]
              != '\n') {
LAB_001e239b:
            bVar27 = true;
            if (lVar39 != -1) {
              lVar39 = lVar39 + 1;
              do {
                (this->m_filter_arena).str[(long)pcVar38] = '\n';
                pcVar38 = pcVar38 + 1;
                lVar39 = lVar39 + -1;
              } while (lVar39 != 0);
            }
            break;
          }
          pcVar40 = pcVar29 + 1;
          if (local_358.len < pcVar40) {
            if ((((byte)s_error_flags & 1) != 0) && (bVar27 = is_debugger_attached(), bVar27)) {
              pcVar3 = (code *)swi(3);
              cVar43 = (csubstr)(*pcVar3)();
              return cVar43;
            }
            handle_error(0x1f7f77,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1533,"first >= 0 && first <= len");
          }
          basic_substring<char>::basic_substring
                    (&local_328,
                     pcVar29 + -0x37 +
                     (long)((stack<c4::yml::Parser::State,_16UL> *)((long)local_358.str + 0x38))->
                           m_buf,local_358.len - (long)pcVar40);
          lVar39 = lVar37 + 1;
          local_2d8.len = CONCAT35(local_328.len._5_3_,(undefined5)local_328.len);
          local_2d8.str = local_328.str;
          local_2b8 = lVar37;
          pcVar31 = (char *)basic_substring<const_char>::first_not_of(&local_2d8,' ',0);
          if (pcVar31 != (char *)0xffffffffffffffff) {
            pcVar33 = pcVar31 + (long)pcVar29;
            pcVar34 = pcVar31 + (long)pcVar29 + 1;
            if (pcVar31 + (long)pcVar29 + 1 < local_358.len) {
              pcVar34 = (char *)local_358.len;
            }
            do {
              pcVar1 = pcVar33 + 1;
              pcVar29 = pcVar34;
              if (local_358.len <= pcVar1) break;
              pcVar26 = pcVar33 + -0x37;
              pcVar33 = pcVar1;
              pcVar29 = pcVar1;
            } while (pcVar26[(long)((stack<c4::yml::Parser::State,_16UL> *)
                                   ((long)local_358.str + 0x38))->m_buf] == '\r');
            pPVar36 = (Parser *)local_358.str;
            if (local_2d8.len <= pcVar31) {
              uStack_318 = 0x2074737269;
              uStack_313 = 0x72203c;
              uStack_310 = 0x6d65;
              uStack_30e = 0x6e656c2e;
              uStack_30a = 0x29;
              uStack_309 = 0;
              local_328.str = (char *)0x6166206b63656863;
              local_328.len._0_5_ = 0x3a64656c69;
              local_328.len._5_3_ = 0x662820;
              if ((((byte)s_error_flags & 1) != 0) && (bVar27 = is_debugger_attached(), bVar27)) {
                pcVar3 = (code *)swi(3);
                cVar43 = (csubstr)(*pcVar3)();
                return cVar43;
              }
              local_148 = 0;
              uStack_140 = 0x7e33;
              local_138 = 0;
              pcStack_130 = 
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              ;
              local_128 = 0x65;
              pPVar36 = (Parser *)0x0;
              LVar4.super_LineCol.col = 0;
              LVar4.super_LineCol.offset = SUB168(ZEXT816(0x7e33) << 0x40,0);
              LVar4.super_LineCol.line = SUB168(ZEXT816(0x7e33) << 0x40,8);
              LVar4.name.str =
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              ;
              LVar4.name.len = 0x65;
              (*(local_348->m_stack).m_callbacks.m_error)
                        ((char *)&local_328,0x20,LVar4,(local_348->m_stack).m_callbacks.m_user_data)
              ;
            }
            pcVar33 = local_2f0;
            if (local_358.len <= pcVar40 + (long)pcVar31) {
              uStack_318 = 0x69662b312b;
              uStack_313 = 0x747372;
              uStack_310 = 0x3c20;
              uStack_30e = 0x6c2e7220;
              uStack_30a = 0x65;
              uStack_309 = 0x6e;
              local_328.str = (char *)0x6166206b63656863;
              local_328.len._0_5_ = 0x3a64656c69;
              local_328.len._5_3_ = 0x692820;
              uStack_308 = 0x29;
              if ((((byte)s_error_flags & 1) != 0) && (bVar27 = is_debugger_attached(), bVar27)) {
                pcVar3 = (code *)swi(3);
                cVar43 = (csubstr)(*pcVar3)();
                return cVar43;
              }
              local_170 = 0;
              uStack_168 = 0x7e34;
              local_160 = 0;
              pcStack_158 = 
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              ;
              local_150 = 0x65;
              pPVar36 = (Parser *)0x0;
              LVar5.super_LineCol.col = 0;
              LVar5.super_LineCol.offset = SUB168(ZEXT816(0x7e34) << 0x40,0);
              LVar5.super_LineCol.line = SUB168(ZEXT816(0x7e34) << 0x40,8);
              LVar5.name.str =
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              ;
              LVar5.name.len = 0x65;
              (*(local_348->m_stack).m_callbacks.m_error)
                        ((char *)&local_328,0x22,LVar5,(local_348->m_stack).m_callbacks.m_user_data)
              ;
            }
            if (pcVar33 < pcVar31) goto LAB_001e176e;
            if (local_358.len <= pcVar29) {
              if ((((byte)s_error_flags & 1) != 0) && (bVar27 = is_debugger_attached(), bVar27)) {
                pcVar3 = (code *)swi(3);
                cVar43 = (csubstr)(*pcVar3)();
                return cVar43;
              }
              handle_error(0x1f7f77,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           ,0x14c3,"i >= 0 && i < len");
            }
            if ((pcVar29 + -0x38)
                [(long)((stack<c4::yml::Parser::State,_16UL> *)((long)local_358.str + 0x38))->m_buf]
                != '\n') goto LAB_001e176e;
            lVar41 = lVar41 + 1;
            local_2c8 = local_2c8 + 1;
            lVar37 = lVar39;
            goto LAB_001e1352;
          }
          if (local_358.len < pcVar40) {
            uStack_318 = 0x3d3c20312b;
            uStack_313 = 0x2e7220;
            uStack_310 = 0x656c;
            uStack_30e = CONCAT13(uStack_30e._3_1_,0x296e);
            local_328.str = (char *)0x6166206b63656863;
            local_328.len._0_5_ = 0x3a64656c69;
            local_328.len._5_3_ = 0x692820;
            if ((((byte)s_error_flags & 1) != 0) && (bVar27 = is_debugger_attached(), bVar27)) {
              pcVar3 = (code *)swi(3);
              cVar43 = (csubstr)(*pcVar3)();
              return cVar43;
            }
            local_198 = 0;
            uStack_190 = 0x7e4f;
            local_188 = 0;
            pcStack_180 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            local_178 = 0x65;
            pPVar36 = (Parser *)0x0;
            LVar6.super_LineCol.col = 0;
            LVar6.super_LineCol.offset = SUB168(ZEXT816(0x7e4f) << 0x40,0);
            LVar6.super_LineCol.line = SUB168(ZEXT816(0x7e4f) << 0x40,8);
            LVar6.name.str =
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            LVar6.name.len = 0x65;
            (*(local_348->m_stack).m_callbacks.m_error)
                      ((char *)&local_328,0x1d,LVar6,(local_348->m_stack).m_callbacks.m_user_data);
          }
          this = local_348;
          if ((char *)local_2d8.len == (char *)0x0) {
            if (pcVar40 != (char *)local_358.len) {
              uStack_318 = 0x3d3d20312b;
              uStack_313 = 0x2e7220;
              uStack_310 = 0x656c;
              uStack_30e = CONCAT13(uStack_30e._3_1_,0x296e);
              local_328.str = (char *)0x6166206b63656863;
              local_328.len._0_5_ = 0x3a64656c69;
              local_328.len._5_3_ = 0x692820;
              local_338 = pcVar38;
              if ((((byte)s_error_flags & 1) != 0) && (bVar27 = is_debugger_attached(), bVar27)) {
                pcVar3 = (code *)swi(3);
                cVar43 = (csubstr)(*pcVar3)();
                return cVar43;
              }
              local_1c0 = 0;
              uStack_1b8 = 0x7e68;
              local_1b0 = 0;
              pcStack_1a8 = 
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              ;
              local_1a0 = 0x65;
              LVar18.super_LineCol.col = 0;
              LVar18.super_LineCol.offset = SUB168(ZEXT816(0x7e68) << 0x40,0);
              LVar18.super_LineCol.line = SUB168(ZEXT816(0x7e68) << 0x40,8);
              LVar18.name.str =
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              ;
              LVar18.name.len = 0x65;
              (*(this->m_stack).m_callbacks.m_error)
                        ((char *)&local_328,0x1d,LVar18,(this->m_stack).m_callbacks.m_user_data);
              if ((char *)local_2d8.len != (char *)0x0) {
                uStack_318 = 0x656c2e6d65;
                uStack_313 = 0x3d206e;
                uStack_310 = 0x203d;
                uStack_30e = CONCAT13(uStack_30e._3_1_,0x2930);
                local_328.str = (char *)0x6166206b63656863;
                local_328.len._0_5_ = 0x3a64656c69;
                local_328.len._5_3_ = 0x722820;
                if ((((byte)s_error_flags & 1) != 0) && (bVar27 = is_debugger_attached(), bVar27)) {
                  pcVar3 = (code *)swi(3);
                  cVar43 = (csubstr)(*pcVar3)();
                  return cVar43;
                }
                local_1e8 = 0;
                uStack_1e0 = 0x7e69;
                local_1d8 = 0;
                pcStack_1d0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                local_1c8 = 0x65;
                LVar19.super_LineCol.col = 0;
                LVar19.super_LineCol.offset = SUB168(ZEXT816(0x7e69) << 0x40,0);
                LVar19.super_LineCol.line = SUB168(ZEXT816(0x7e69) << 0x40,8);
                LVar19.name.str =
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                LVar19.name.len = 0x65;
                (*(this->m_stack).m_callbacks.m_error)
                          ((char *)&local_328,0x1d,LVar19,(this->m_stack).m_callbacks.m_user_data);
              }
            }
            goto LAB_001e239b;
          }
          if ((local_2d8.len < local_2f0) || (local_2d8.len <= local_2f0)) goto LAB_001e239b;
          pcVar29 = pcVar29 + local_2d8.len + 1;
LAB_001e176e:
          if (pcVar29 < local_358.len) {
            do {
              pPVar36 = (Parser *)local_358.str;
              if ((pcVar29 + -0x38)
                  [(long)((stack<c4::yml::Parser::State,_16UL> *)((long)local_358.str + 0x38))->
                         m_buf] != '\t') goto LAB_001e1794;
              pcVar29 = pcVar29 + 1;
              pcVar40 = (char *)local_358.len;
            } while ((char *)local_358.len != pcVar29);
          }
          else {
LAB_001e1794:
            pcVar40 = pcVar29;
            if (local_358.len < pcVar29) {
              uStack_308 = 0x6361;
              uStack_306 = 0x3d3c2065;
              uStack_302 = 0x20;
              uStack_301 = 0x72;
              uStack_300 = 0x6c2e;
              uStack_2fe = 0x296e65;
              uStack_318 = 0x5f74737269;
              uStack_313 = 0x6e6f6e;
              uStack_310 = 0x775f;
              uStack_30e = 0x65746968;
              uStack_30a = 0x73;
              uStack_309 = 0x70;
              local_328.str = (char *)0x6166206b63656863;
              local_328.len._0_5_ = 0x3a64656c69;
              local_328.len._5_3_ = 0x662820;
              if ((((byte)s_error_flags & 1) != 0) && (bVar27 = is_debugger_attached(), bVar27)) {
                pcVar3 = (code *)swi(3);
                cVar43 = (csubstr)(*pcVar3)();
                return cVar43;
              }
              local_210 = 0;
              uStack_208 = 0x7e7b;
              local_200 = 0;
              pcStack_1f8 = 
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              ;
              local_1f0 = 0x65;
              pPVar36 = (Parser *)0x0;
              LVar7.super_LineCol.col = 0;
              LVar7.super_LineCol.offset = SUB168(ZEXT816(0x7e7b) << 0x40,0);
              LVar7.super_LineCol.line = SUB168(ZEXT816(0x7e7b) << 0x40,8);
              LVar7.name.str =
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              ;
              LVar7.name.len = 0x65;
              (*(local_348->m_stack).m_callbacks.m_error)
                        ((char *)&local_328,0x2e,LVar7,(local_348->m_stack).m_callbacks.m_user_data)
              ;
            }
          }
          sVar32 = basic_substring<char>::last_of(&local_358,'\n',(size_t)pcVar40);
          pcVar31 = (char *)(sVar32 + 1);
          if (pcVar40 < pcVar31) {
            uStack_308 = 0x6361;
            uStack_306 = 0x3d3e2065;
            uStack_302 = 0x20;
            uStack_301 = 0x6c;
            uStack_300 = 0x7361;
            uStack_2fe = 0x656e5f74;
            uStack_318 = 0x5f74737269;
            uStack_313 = 0x6e6f6e;
            uStack_310 = 0x775f;
            uStack_30e = 0x65746968;
            uStack_30a = 0x73;
            uStack_309 = 0x70;
            local_328.str = (char *)0x6166206b63656863;
            local_328.len._0_5_ = 0x3a64656c69;
            local_328.len._5_3_ = 0x662820;
            uStack_2fa = 0x77;
            uStack_2f9 = 0x6c;
            uStack_2f8 = 0x2931202b20;
            if ((((byte)s_error_flags & 1) != 0) && (bVar27 = is_debugger_attached(), bVar27)) {
              pcVar3 = (code *)swi(3);
              cVar43 = (csubstr)(*pcVar3)();
              return cVar43;
            }
            local_238 = 0;
            uStack_230 = 0x7e7f;
            local_228 = 0;
            pcStack_220 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            local_218 = 0x65;
            pPVar36 = (Parser *)0x0;
            LVar8.super_LineCol.col = 0;
            LVar8.super_LineCol.offset = SUB168(ZEXT816(0x7e7f) << 0x40,0);
            LVar8.super_LineCol.line = SUB168(ZEXT816(0x7e7f) << 0x40,8);
            LVar8.name.str =
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            LVar8.name.len = 0x65;
            (*(local_348->m_stack).m_callbacks.m_error)
                      ((char *)&local_328,0x36,LVar8,(local_348->m_stack).m_callbacks.m_user_data);
          }
          pcVar29 = pcVar40 + ~sVar32;
          local_2c0 = sVar32;
          if (pcVar29 < local_2f0) {
            uStack_308 = 0x3d3e;
            uStack_306 = 0x646e6920;
            uStack_302 = 0x65;
            uStack_301 = 0x6e;
            uStack_300 = 0x6174;
            uStack_2fe = 0x6e6f6974;
            uStack_2fa = 0x29;
            uStack_2f9 = 0;
            uStack_318 = 0x695f736968;
            uStack_313 = 0x65646e;
            uStack_310 = 0x746e;
            uStack_30e = 0x6f697461;
            uStack_30a = 0x6e;
            uStack_309 = 0x20;
            local_328.str = (char *)0x6166206b63656863;
            local_328.len._0_5_ = 0x3a64656c69;
            local_328.len._5_3_ = 0x742820;
            if ((((byte)s_error_flags & 1) != 0) && (bVar27 = is_debugger_attached(), bVar27)) {
              pcVar3 = (code *)swi(3);
              cVar43 = (csubstr)(*pcVar3)();
              return cVar43;
            }
            local_260 = 0;
            uStack_258 = 0x7e80;
            local_250 = 0;
            pcStack_248 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            local_240 = 0x65;
            pPVar36 = (Parser *)0x0;
            LVar9.super_LineCol.col = 0;
            LVar9.super_LineCol.offset = SUB168(ZEXT816(0x7e80) << 0x40,0);
            LVar9.super_LineCol.line = SUB168(ZEXT816(0x7e80) << 0x40,8);
            LVar9.name.str =
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            LVar9.name.len = 0x65;
            (*(local_348->m_stack).m_callbacks.m_error)
                      ((char *)&local_328,0x30,LVar9,(local_348->m_stack).m_callbacks.m_user_data);
          }
          pcVar33 = local_2f0;
          this = local_348;
          if ((local_33c & 1) == 0) {
            if (local_2b8 != -2) {
              do {
                (local_348->m_filter_arena).str[(long)pcVar38] = '\n';
                pcVar38 = pcVar38 + 1;
                lVar41 = lVar41 + -1;
              } while (lVar41 != 0);
            }
            if (local_2f0 < pcVar29) {
              pcVar29 = local_2f0 + local_2c0;
              local_32c = (uint)CONCAT71((int7)((ulong)local_2f0 >> 8),1);
            }
            else {
              pcVar29 = pcVar40 + -1;
            }
            local_33c = 0;
            bVar27 = true;
            pPVar36 = local_348;
          }
          else if (pcVar29 == local_2f0) {
            pcVar29 = pcVar40;
            if ((local_32c & 1) == 0) {
              lVar37 = local_2c8;
              if (lVar39 == 0) {
                pcVar33 = (local_348->m_filter_arena).str;
                pcVar33[(long)pcVar38] = ' ';
                pcVar38 = pcVar38 + 1;
              }
              else {
                do {
                  pcVar33 = (local_348->m_filter_arena).str;
                  pcVar33[(long)pcVar38] = '\n';
                  pcVar38 = pcVar38 + 1;
                  lVar37 = lVar37 + -1;
                } while (lVar37 != 0);
                pPVar36 = (Parser *)0x0;
              }
            }
            else {
              if (lVar39 != -1) {
                do {
                  pcVar33 = (local_348->m_filter_arena).str;
                  pcVar33[(long)pcVar38] = '\n';
                  pcVar38 = pcVar38 + 1;
                  lVar41 = lVar41 + -1;
                } while (lVar41 != 0);
              }
              pcVar31 = pcVar31 + (long)local_2f0;
              pcVar29 = pcVar31;
              pPVar36 = local_348;
              for (; pcVar31 < pcVar40; pcVar31 = pcVar31 + 1) {
                cVar2 = (pcVar31 + -0x38)
                        [(long)((stack<c4::yml::Parser::State,_16UL> *)((long)local_358.str + 0x38))
                               ->m_buf];
                pcVar33 = (char *)CONCAT71((int7)((ulong)local_358.str >> 8),cVar2);
                if (cVar2 != '\r') {
                  pPVar36 = (Parser *)(local_348->m_filter_arena).str;
                  (pcVar38 + -0x38)[(long)(pPVar36->m_stack).m_buf] = cVar2;
                  pcVar38 = pcVar38 + 1;
                }
                pcVar29 = pcVar40;
              }
            }
            local_32c = 0;
            pcVar29 = pcVar29 + -1;
            bVar27 = true;
            local_33c = (uint)CONCAT71((int7)((ulong)pcVar33 >> 8),1);
          }
          else {
            pcVar34 = local_2f0;
            if (pcVar29 <= local_2f0) {
              uStack_308 = 0x203e;
              uStack_306 = 0x65646e69;
              uStack_302 = 0x6e;
              uStack_301 = 0x74;
              uStack_300 = 0x7461;
              uStack_2fe = 0x296e6f69;
              uStack_2fa = 0;
              uStack_318 = 0x695f736968;
              uStack_313 = 0x65646e;
              uStack_310 = 0x746e;
              uStack_30e = 0x6f697461;
              uStack_30a = 0x6e;
              uStack_309 = 0x20;
              local_328.str = (char *)0x6166206b63656863;
              local_328.len._0_5_ = 0x3a64656c69;
              local_328.len._5_3_ = 0x742820;
              if ((((byte)s_error_flags & 1) != 0) && (bVar27 = is_debugger_attached(), bVar27)) {
                pcVar3 = (code *)swi(3);
                cVar43 = (csubstr)(*pcVar3)();
                return cVar43;
              }
              local_288 = 0;
              uStack_280 = 0x7eb1;
              local_278 = 0;
              pcStack_270 = 
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              ;
              local_268 = 0x65;
              LVar10.super_LineCol.col = 0;
              LVar10.super_LineCol.offset = SUB168(ZEXT816(0x7eb1) << 0x40,0);
              LVar10.super_LineCol.line = SUB168(ZEXT816(0x7eb1) << 0x40,8);
              LVar10.name.str =
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              ;
              LVar10.name.len = 0x65;
              pcVar34 = (char *)(*(local_348->m_stack).m_callbacks.m_error)
                                          ((char *)&local_328,0x2f,LVar10,
                                           (local_348->m_stack).m_callbacks.m_user_data);
            }
            if (lVar39 != -1) {
              do {
                pcVar34 = (local_348->m_filter_arena).str;
                pcVar34[(long)pcVar38] = '\n';
                pcVar38 = pcVar38 + 1;
                lVar41 = lVar41 + -1;
              } while (lVar41 != 0);
            }
            pcVar31 = pcVar31 + (long)pcVar33;
            pcVar29 = pcVar31;
            pPVar36 = local_348;
            for (; pcVar31 < pcVar40; pcVar31 = pcVar31 + 1) {
              cVar2 = (pcVar31 + -0x38)
                      [(long)((stack<c4::yml::Parser::State,_16UL> *)((long)local_358.str + 0x38))->
                             m_buf];
              pcVar34 = (char *)CONCAT71((int7)((ulong)local_358.str >> 8),cVar2);
              if (cVar2 != '\r') {
                pPVar36 = (Parser *)(local_348->m_filter_arena).str;
                (pcVar38 + -0x38)[(long)(pPVar36->m_stack).m_buf] = cVar2;
                pcVar38 = pcVar38 + 1;
              }
              pcVar29 = pcVar40;
            }
            pcVar29 = pcVar29 + -1;
            bVar27 = true;
            uVar35 = (undefined7)((ulong)pcVar34 >> 8);
            local_33c = (uint)CONCAT71(uVar35,1);
            local_32c = (uint)CONCAT71(uVar35,1);
            this = local_348;
          }
        }
        pcVar29 = pcVar29 + 1;
      } while (pcVar29 < local_358.len);
      chomp = local_330;
      pcVar29 = (char *)(this->m_filter_arena).len;
      local_338 = pcVar38;
      if (pcVar29 < pcVar38) {
        uStack_308 = 0x6572;
        uStack_306 = 0x6c2e616e;
        uStack_302 = 0x65;
        uStack_301 = 0x6e;
        uStack_300 = 0x29;
        uStack_318 = 0x3d3c20736f;
        uStack_313 = 0x5f6d20;
        uStack_310 = 0x6966;
        uStack_30e = 0x7265746c;
        uStack_30a = 0x5f;
        uStack_309 = 0x61;
        local_328.str = (char *)0x6166206b63656863;
        local_328.len._0_5_ = 0x3a64656c69;
        local_328.len._5_3_ = 0x702820;
        if ((((byte)s_error_flags & 1) != 0) && (bVar28 = is_debugger_attached(), bVar28)) {
          pcVar3 = (code *)swi(3);
          cVar43 = (csubstr)(*pcVar3)();
          return cVar43;
        }
        local_2b0 = 0;
        uStack_2a8 = 0x7ebd;
        local_2a0 = 0;
        pcStack_298 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_290 = 0x65;
        LVar17.super_LineCol.col = 0;
        LVar17.super_LineCol.offset = SUB168(ZEXT816(0x7ebd) << 0x40,0);
        LVar17.super_LineCol.line = SUB168(ZEXT816(0x7ebd) << 0x40,8);
        LVar17.name.str =
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        LVar17.name.len = 0x65;
        (*(this->m_stack).m_callbacks.m_error)
                  ((char *)&local_328,0x2a,LVar17,(this->m_stack).m_callbacks.m_user_data);
        pcVar29 = (char *)(this->m_filter_arena).len;
      }
    }
    else {
      local_338 = (char *)0x0;
      pcVar29 = (char *)(this->m_filter_arena).len;
      bVar27 = false;
    }
    sVar44.len = (size_t)pcVar29;
    sVar44.str = (this->m_filter_arena).str;
    bVar28 = _apply_chomp(this,sVar44,(size_t *)&local_338,chomp);
    cVar22.len = local_358.len;
    cVar22.str = local_358.str;
    pcVar29 = local_338;
    if (((local_358.len <= local_338) && (!bVar27)) && (!bVar28)) {
      return cVar22;
    }
  }
  else {
    if (style != BLOCK_LITERAL) {
      bVar27 = is_debugger_attached();
      if ((bVar27) && (bVar27 = is_debugger_attached(), bVar27)) {
        pcVar3 = (code *)swi(3);
        cVar43 = (csubstr)(*pcVar3)();
        return cVar43;
      }
      fmt.len = 0x1a;
      fmt.str = "ERROR: unknown block style";
      _err<>(this,fmt);
      cVar21.len = local_358.len;
      cVar21.str = local_358.str;
      return cVar21;
    }
    pcVar29 = (char *)basic_substring<char>::first_not_of(&local_358,' ',0);
    if (pcVar29 == (char *)0xffffffffffffffff) {
      cVar24.len = 0;
      cVar24.str = local_358.str;
      cVar23.len = 0;
      cVar23.str = local_358.str;
      if (chomp != CHOMP_KEEP) {
        return cVar23;
      }
      if ((char *)local_358.len == (char *)0x0) {
        return cVar24;
      }
      *(undefined1 *)&((ParserOptions *)local_358.str)->flags = 10;
      if ((char *)local_358.len != (char *)0x0) {
        basic_substring<char>::basic_substring(&local_328,local_358.str,1);
        cVar25.len._5_3_ = local_328.len._5_3_;
        cVar25.len._0_5_ = (undefined5)local_328.len;
        cVar25.str = local_328.str;
        return cVar25;
      }
      if ((((byte)s_error_flags & 1) != 0) && (bVar27 = is_debugger_attached(), bVar27)) {
        pcVar3 = (code *)swi(3);
        cVar43 = (csubstr)(*pcVar3)();
        return cVar43;
      }
      handle_error(0x1f7f77,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x154e,"num <= len || num == npos");
    }
    if (indentation < pcVar29) {
      if (local_358.len < indentation) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar27 = is_debugger_attached(), bVar27)) {
          pcVar3 = (code *)swi(3);
          cVar43 = (csubstr)(*pcVar3)();
          return cVar43;
        }
        handle_error(0x1f7f77,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x1533,"first >= 0 && first <= len");
      }
      basic_substring<char>::basic_substring
                (&local_328,
                 (char *)((long)((stack<c4::yml::Parser::State,_16UL> *)((long)local_358.str + 0x38)
                                )->m_buf + (indentation - 0x38)),local_358.len - indentation);
    }
    else {
      if (local_358.len < pcVar29) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar27 = is_debugger_attached(), bVar27)) {
          pcVar3 = (code *)swi(3);
          cVar43 = (csubstr)(*pcVar3)();
          return cVar43;
        }
        handle_error(0x1f7f77,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x1533,"first >= 0 && first <= len");
      }
      basic_substring<char>::basic_substring
                (&local_328,
                 pcVar29 + -0x38 +
                 (long)((stack<c4::yml::Parser::State,_16UL> *)((long)local_358.str + 0x38))->m_buf,
                 local_358.len - (long)pcVar29);
    }
    local_358.len = CONCAT35(local_328.len._5_3_,(undefined5)local_328.len);
    local_358.str = local_328.str;
    pcVar38 = (char *)(local_2e8.len + 2);
    pcVar29 = (char *)(this->m_filter_arena).len;
    if (pcVar29 < pcVar38) {
      pcVar29 = (char *)((long)pcVar29 * 2);
      if (pcVar29 <= pcVar38) {
        pcVar29 = pcVar38;
      }
      pcVar38 = (char *)0x80;
      if ((char *)0x80 < pcVar29) {
        pcVar38 = pcVar29;
      }
      _resize_filter_arena(this,(size_t)pcVar38);
    }
    if ((char *)local_358.len == (char *)0x0) {
      local_338 = (char *)0x0;
      local_330 = chomp;
    }
    else {
      pcVar40 = (char *)0x0;
      pcVar38 = (char *)0x0;
      pcVar29 = (char *)local_358.len;
      local_330 = chomp;
      do {
        cVar2 = (pcVar40 + -0x38)
                [(long)((stack<c4::yml::Parser::State,_16UL> *)((long)local_358.str + 0x38))->m_buf]
        ;
        pcVar31 = pcVar38;
        if (cVar2 != '\r') {
          pcVar31 = pcVar38 + 1;
          (this->m_filter_arena).str[(long)pcVar38] = cVar2;
          pcVar29 = (char *)local_358.len;
          if (cVar2 == '\n') {
            if (local_358.len <= pcVar40) {
              if ((((byte)s_error_flags & 1) != 0) && (bVar27 = is_debugger_attached(), bVar27)) {
                pcVar3 = (code *)swi(3);
                cVar43 = (csubstr)(*pcVar3)();
                return cVar43;
              }
              handle_error(0x1f7f77,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           ,0x1533,"first >= 0 && first <= len");
            }
            pcVar33 = pcVar40 + 1;
            basic_substring<char>::basic_substring
                      (&local_328,
                       pcVar40 + -0x37 +
                       (long)((stack<c4::yml::Parser::State,_16UL> *)((long)local_358.str + 0x38))->
                             m_buf,local_358.len - (long)pcVar33);
            local_2d8.len = CONCAT35(local_328.len._5_3_,(undefined5)local_328.len);
            local_2d8.str = local_328.str;
            pcVar29 = (char *)basic_substring<const_char>::first_not_of(&local_2d8,' ',0);
            this = local_348;
            if (pcVar29 == (char *)0xffffffffffffffff) {
              if (local_358.len <= pcVar40) {
                uStack_318 = 0x3d3c20312b;
                uStack_313 = 0x2e7220;
                uStack_310 = 0x656c;
                uStack_30e = CONCAT13(uStack_30e._3_1_,0x296e);
                local_328.str = (char *)0x6166206b63656863;
                local_328.len._0_5_ = 0x3a64656c69;
                local_328.len._5_3_ = 0x692820;
                if ((((byte)s_error_flags & 1) != 0) && (bVar27 = is_debugger_attached(), bVar27)) {
                  pcVar3 = (code *)swi(3);
                  cVar43 = (csubstr)(*pcVar3)();
                  return cVar43;
                }
                local_a8 = 0;
                uStack_a0 = 0x7ddc;
                local_98 = 0;
                pcStack_90 = 
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                local_88 = 0x65;
                LVar13.super_LineCol.col = 0;
                LVar13.super_LineCol.offset = SUB168(ZEXT816(0x7ddc) << 0x40,0);
                LVar13.super_LineCol.line = SUB168(ZEXT816(0x7ddc) << 0x40,8);
                LVar13.name.str =
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                LVar13.name.len = 0x65;
                (*(this->m_stack).m_callbacks.m_error)
                          ((char *)&local_328,0x1d,LVar13,(this->m_stack).m_callbacks.m_user_data);
              }
              pcVar29 = (char *)local_358.len;
              if ((char *)local_2d8.len == (char *)0x0) {
                if (pcVar33 == (char *)local_358.len) {
                  local_338 = pcVar31;
                  if (local_330 == CHOMP_STRIP) {
                    local_338 = pcVar38;
                  }
                  break;
                }
              }
              else {
                local_338 = pcVar38;
                if (local_2d8.len < local_2f0) break;
                pcVar40 = pcVar40 + (long)local_2f0;
              }
            }
            else {
              if (local_2d8.len <= pcVar29) {
                uStack_318 = 0x2074737269;
                uStack_313 = 0x72203c;
                uStack_310 = 0x6d65;
                uStack_30e = 0x6e656c2e;
                uStack_30a = 0x29;
                uStack_309 = 0;
                local_328.str = (char *)0x6166206b63656863;
                local_328.len._0_5_ = 0x3a64656c69;
                local_328.len._5_3_ = 0x662820;
                if ((((byte)s_error_flags & 1) != 0) && (bVar27 = is_debugger_attached(), bVar27)) {
                  pcVar3 = (code *)swi(3);
                  cVar43 = (csubstr)(*pcVar3)();
                  return cVar43;
                }
                local_58 = 0;
                uStack_50 = 0x7dcc;
                local_48 = 0;
                pcStack_40 = 
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                local_38 = 0x65;
                LVar11.super_LineCol.col = 0;
                LVar11.super_LineCol.offset = SUB168(ZEXT816(0x7dcc) << 0x40,0);
                LVar11.super_LineCol.line = SUB168(ZEXT816(0x7dcc) << 0x40,8);
                LVar11.name.str =
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                LVar11.name.len = 0x65;
                (*(local_348->m_stack).m_callbacks.m_error)
                          ((char *)&local_328,0x20,LVar11,
                           (local_348->m_stack).m_callbacks.m_user_data);
              }
              pcVar38 = local_2f0;
              if (local_358.len <= pcVar33 + (long)pcVar29) {
                uStack_318 = 0x69662b312b;
                uStack_313 = 0x747372;
                uStack_310 = 0x3c20;
                uStack_30e = 0x6c2e7220;
                uStack_30a = 0x65;
                uStack_309 = 0x6e;
                local_328.str = (char *)0x6166206b63656863;
                local_328.len._0_5_ = 0x3a64656c69;
                local_328.len._5_3_ = 0x692820;
                uStack_308 = 0x29;
                if ((((byte)s_error_flags & 1) != 0) && (bVar27 = is_debugger_attached(), bVar27)) {
                  pcVar3 = (code *)swi(3);
                  cVar43 = (csubstr)(*pcVar3)();
                  return cVar43;
                }
                local_80 = 0;
                uStack_78 = 0x7dcd;
                local_70 = 0;
                pcStack_68 = 
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                local_60 = 0x65;
                LVar12.super_LineCol.col = 0;
                LVar12.super_LineCol.offset = SUB168(ZEXT816(0x7dcd) << 0x40,0);
                LVar12.super_LineCol.line = SUB168(ZEXT816(0x7dcd) << 0x40,8);
                LVar12.name.str =
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                LVar12.name.len = 0x65;
                (*(local_348->m_stack).m_callbacks.m_error)
                          ((char *)&local_328,0x22,LVar12,
                           (local_348->m_stack).m_callbacks.m_user_data);
              }
              if (pcVar29 < pcVar38) {
                pcVar38 = pcVar29;
              }
              pcVar40 = pcVar40 + (long)pcVar38;
              pcVar29 = (char *)local_358.len;
              this = local_348;
            }
          }
        }
        pcVar38 = pcVar31;
        pcVar40 = pcVar40 + 1;
        local_338 = pcVar38;
      } while (pcVar40 < pcVar29);
    }
    chomp_00 = local_330;
    if (local_2e8.len < local_338) {
      uStack_318 = 0x206e656c2e;
      uStack_313 = 0x203d3e;
      uStack_310 = 0x6f70;
      uStack_30e = CONCAT13(uStack_30e._3_1_,0x2973);
      local_328.str = (char *)0x6166206b63656863;
      local_328.len._0_5_ = 0x3a64656c69;
      local_328.len._5_3_ = 0x732820;
      if ((((byte)s_error_flags & 1) != 0) && (bVar27 = is_debugger_attached(), bVar27)) {
        pcVar3 = (code *)swi(3);
        cVar43 = (csubstr)(*pcVar3)();
        return cVar43;
      }
      local_d0 = 0;
      uStack_c8 = 0x7df6;
      local_c0 = 0;
      pcStack_b8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_b0 = 0x65;
      LVar14.super_LineCol.col = 0;
      LVar14.super_LineCol.offset = SUB168(ZEXT816(0x7df6) << 0x40,0);
      LVar14.super_LineCol.line = SUB168(ZEXT816(0x7df6) << 0x40,8);
      LVar14.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar14.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                ((char *)&local_328,0x1d,LVar14,(this->m_stack).m_callbacks.m_user_data);
    }
    bVar27 = _apply_chomp(this,this->m_filter_arena,(size_t *)&local_338,chomp_00);
    pcVar29 = local_338;
    if ((char *)(this->m_filter_arena).len < local_338) {
      uStack_308 = 0x6572;
      uStack_306 = 0x6c2e616e;
      uStack_302 = 0x65;
      uStack_301 = 0x6e;
      uStack_300 = 0x29;
      uStack_318 = 0x3d3c20736f;
      uStack_313 = 0x5f6d20;
      uStack_310 = 0x6966;
      uStack_30e = 0x7265746c;
      uStack_30a = 0x5f;
      uStack_309 = 0x61;
      local_328.str = (char *)0x6166206b63656863;
      local_328.len._0_5_ = 0x3a64656c69;
      local_328.len._5_3_ = 0x702820;
      if ((((byte)s_error_flags & 1) != 0) && (bVar28 = is_debugger_attached(), bVar28)) {
        pcVar3 = (code *)swi(3);
        cVar43 = (csubstr)(*pcVar3)();
        return cVar43;
      }
      local_f8 = 0;
      uStack_f0 = 0x7df9;
      local_e8 = 0;
      pcStack_e0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_d8 = 0x65;
      LVar15.super_LineCol.col = 0;
      LVar15.super_LineCol.offset = SUB168(ZEXT816(0x7df9) << 0x40,0);
      LVar15.super_LineCol.line = SUB168(ZEXT816(0x7df9) << 0x40,8);
      LVar15.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar15.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                ((char *)&local_328,0x2a,LVar15,(this->m_stack).m_callbacks.m_user_data);
    }
    if (local_2e8.len < pcVar29) {
      uStack_318 = 0x3d3c20736f;
      uStack_313 = 0x2e7320;
      uStack_310 = 0x656c;
      uStack_30e = CONCAT13(uStack_30e._3_1_,0x296e);
      local_328.str = (char *)0x6166206b63656863;
      local_328.len._0_5_ = 0x3a64656c69;
      local_328.len._5_3_ = 0x702820;
      if ((((byte)s_error_flags & 1) != 0) && (bVar28 = is_debugger_attached(), bVar28)) {
        pcVar3 = (code *)swi(3);
        cVar43 = (csubstr)(*pcVar3)();
        return cVar43;
      }
      local_120 = 0;
      uStack_118 = 0x7dfa;
      local_110 = 0;
      pcStack_108 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_100 = 0x65;
      LVar16.super_LineCol.col = 0;
      LVar16.super_LineCol.offset = SUB168(ZEXT816(0x7dfa) << 0x40,0);
      LVar16.super_LineCol.line = SUB168(ZEXT816(0x7dfa) << 0x40,8);
      LVar16.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar16.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                ((char *)&local_328,0x1d,LVar16,(this->m_stack).m_callbacks.m_user_data);
    }
    cVar20.len = local_358.len;
    cVar20.str = local_358.str;
    if ((~bVar27 & local_358.len <= pcVar29) != 0) {
      return cVar20;
    }
  }
  dst.len = local_2e8.len;
  dst.str = local_2e8.str;
  sVar44 = _finish_filter_arena(this,dst,(size_t)pcVar29);
  cVar45.str = sVar44.str;
  cVar45.len = sVar44.len;
  return cVar45;
}

Assistant:

csubstr Parser::_filter_block_scalar(substr s, BlockStyle_e style, BlockChomp_e chomp, size_t indentation)
{
    // a debugging scaffold:
    #if 0
    #define _c4dbgfbl(fmt, ...) _c4dbgpf("filt_block" fmt, __VA_ARGS__)
    #else
    #define _c4dbgfbl(...)
    #endif

    _c4dbgfbl(": indentation={} before=[{}]~~~{}~~~", indentation, s.len, s);

    if(chomp != CHOMP_KEEP && s.trim(" \n\r").len == 0u)
    {
        _c4dbgp("filt_block: empty scalar");
        return s.first(0);
    }

    substr r = s;

    switch(style)
    {
    case BLOCK_LITERAL:
        {
            _c4dbgp("filt_block: style=literal");
            // trim leading whitespace up to indentation
            {
                size_t numws = r.first_not_of(' ');
                if(numws != npos)
                {
                    if(numws > indentation)
                        r = r.sub(indentation);
                    else
                        r = r.sub(numws);
                    _c4dbgfbl(": after triml=[{}]~~~{}~~~", r.len, r);
                }
                else
                {
                    if(chomp != CHOMP_KEEP || r.len == 0)
                    {
                        _c4dbgfbl(": all spaces {}, return empty", r.len);
                        return r.first(0);
                    }
                    else
                    {
                        r[0] = '\n';
                        return r.first(1);
                    }
                }
            }
            _grow_filter_arena(s.len + 2u);  // use s.len! because we may need to add a newline at the end, so the leading indentation will allow space for that newline
            size_t pos = 0; // the filtered size
            for(size_t i = 0; i < r.len; ++i)
            {
                const char curr = r.str[i];
                _c4dbgfbl("[{}]='{}'  pos={}", i, _c4prc(curr), pos);
                if(curr == '\r')
                    continue;
                m_filter_arena.str[pos++] = curr;
                if(curr == '\n')
                {
                    _c4dbgfbl("[{}]: found newline", i);
                    // skip indentation on the next line
                    csubstr rem = r.sub(i+1);
                    size_t first = rem.first_not_of(' ');
                    if(first != npos)
                    {
                        _RYML_CB_ASSERT(m_stack.m_callbacks, first < rem.len);
                        _RYML_CB_ASSERT(m_stack.m_callbacks, i+1+first < r.len);
                        _c4dbgfbl("[{}]: {} spaces follow before next nonws character @ [{}]='{}'", i, first, i+1+first, rem.str[first]);
                        if(first < indentation)
                        {
                            _c4dbgfbl("[{}]: skip {}<{} spaces from indentation", i, first, indentation);
                            i += first;
                        }
                        else
                        {
                            _c4dbgfbl("[{}]: skip {} spaces from indentation", i, indentation);
                            i += indentation;
                        }
                    }
                    else
                    {
                        _RYML_CB_ASSERT(m_stack.m_callbacks, i+1 <= r.len);
                        first = rem.len;
                        _c4dbgfbl("[{}]: {} spaces to the end", i, first);
                        if(first)
                        {
                            if(first < indentation)
                            {
                                _c4dbgfbl("[{}]: skip everything", i);
                                --pos;
                                break;
                            }
                            else
                            {
                                _c4dbgfbl("[{}]: skip {} spaces from indentation", i, indentation);
                                i += indentation;
                            }
                        }
                        else if(i+1 == r.len)
                        {
                            if(chomp == CHOMP_STRIP)
                                --pos;
                            break;
                        }
                    }
                }
            }
            _RYML_CB_ASSERT(m_stack.m_callbacks, s.len >= pos);
            _c4dbgfbl(": #filteredchars={} after=~~~{}~~~", s.len - r.len, r);
            bool changed = _apply_chomp(m_filter_arena, &pos, chomp);
            _RYML_CB_ASSERT(m_stack.m_callbacks, pos <= m_filter_arena.len);
            _RYML_CB_ASSERT(m_stack.m_callbacks, pos <= s.len);
            if(pos < r.len || changed)
            {
                r = _finish_filter_arena(s, pos); // write into s
            }
            break;
        }
    case BLOCK_FOLD:
        {
            _c4dbgp("filt_block: style=fold");
            _grow_filter_arena(r.len + 2);
            size_t pos = 0; // the filtered size
            bool filtered_chars = false;
            bool started = false;
            bool is_indented = false;
            size_t i = r.first_not_of(' ');
            _c4dbgfbl(": first non space at {}", i);
            if(i > indentation)
            {
                is_indented = true;
                i = indentation;
            }
            _c4dbgfbl(": start folding at {}, is_indented={}", i, (int)is_indented);
            auto on_change_indentation = [&](size_t numnl_following, size_t last_newl, size_t first_non_whitespace){
                _c4dbgfbl("[{}]: add 1+{} newlines", i, numnl_following);
                for(size_t j = 0; j < 1 + numnl_following; ++j)
                    m_filter_arena.str[pos++] = '\n';
                for(i = last_newl + 1 + indentation; i < first_non_whitespace; ++i)
                {
                    if(r.str[i] == '\r')
                        continue;
                    _c4dbgfbl("[{}]: add '{}'", i, _c4prc(r.str[i]));
                    m_filter_arena.str[pos++] = r.str[i];
                }
                --i;
            };
            for( ; i < r.len; ++i)
            {
                const char curr = r.str[i];
                _c4dbgfbl("[{}]='{}'", i, _c4prc(curr));
                if(curr == '\n')
                {
                    filtered_chars = true;
                    // skip indentation on the next line, and advance over the next non-indented blank lines as well
                    size_t first_non_whitespace;
                    size_t numnl_following = (size_t)-1;
                    while(r[i] == '\n')
                    {
                        ++numnl_following;
                        csubstr rem = r.sub(i+1);
                        size_t first = rem.first_not_of(' ');
                        _c4dbgfbl("[{}]: found newline. first={} rem.len={}", i, first, rem.len);
                        if(first != npos)
                        {
                            first_non_whitespace = first + i+1;
                            while(first_non_whitespace < r.len && r[first_non_whitespace] == '\r')
                                ++first_non_whitespace;
                            _RYML_CB_ASSERT(m_stack.m_callbacks, first < rem.len);
                            _RYML_CB_ASSERT(m_stack.m_callbacks, i+1+first < r.len);
                            _c4dbgfbl("[{}]: {} spaces follow before next nonws character @ [{}]='{}'", i, first, i+1+first, _c4prc(rem.str[first]));
                            if(first < indentation)
                            {
                                _c4dbgfbl("[{}]: skip {}<{} spaces from indentation", i, first, indentation);
                                i += first;
                            }
                            else
                            {
                                _c4dbgfbl("[{}]: skip {} spaces from indentation", i, indentation);
                                i += indentation;
                                if(first > indentation)
                                {
                                    _c4dbgfbl("[{}]: {} further indented than {}, stop newlining", i, first, indentation);
                                    goto finished_counting_newlines;
                                }
                            }
                            // prepare the next while loop iteration
                            // by setting i at the next newline after
                            // an empty line
                            if(r[first_non_whitespace] == '\n')
                                i = first_non_whitespace;
                            else
                                goto finished_counting_newlines;
                        }
                        else
                        {
                            _RYML_CB_ASSERT(m_stack.m_callbacks, i+1 <= r.len);
                            first = rem.len;
                            first_non_whitespace = first + i+1;
                            if(first)
                            {
                                _c4dbgfbl("[{}]: {} spaces to the end", i, first);
                                if(first < indentation)
                                {
                                    _c4dbgfbl("[{}]: skip everything", i);
                                    i += first;
                                }
                                else
                                {
                                    _c4dbgfbl("[{}]: skip {} spaces from indentation", i, indentation);
                                    i += indentation;
                                    if(first > indentation)
                                    {
                                        _c4dbgfbl("[{}]: {} spaces missing. not done yet", i, indentation - first);
                                        goto finished_counting_newlines;
                                    }
                                }
                            }
                            else // if(i+1 == r.len)
                            {
                                _c4dbgfbl("[{}]: it's the final newline", i);
                                _RYML_CB_ASSERT(m_stack.m_callbacks, i+1 == r.len);
                                _RYML_CB_ASSERT(m_stack.m_callbacks, rem.len == 0);
                            }
                            goto end_of_scalar;
                        }
                    }
                end_of_scalar:
                    // Write all the trailing newlines. Since we're
                    // at the end no folding is needed, so write every
                    // newline (add 1).
                    _c4dbgfbl("[{}]: add {} trailing newlines", i, 1+numnl_following);
                    for(size_t j = 0; j < 1 + numnl_following; ++j)
                        m_filter_arena.str[pos++] = '\n';
                    break;
                finished_counting_newlines:
                    _c4dbgfbl("[{}]: #newlines={} firstnonws={}", i, numnl_following, first_non_whitespace);
                    while(first_non_whitespace < r.len && r[first_non_whitespace] == '\t')
                        ++first_non_whitespace;
                    _c4dbgfbl("[{}]: #newlines={} firstnonws={}", i, numnl_following, first_non_whitespace);
                    _RYML_CB_ASSERT(m_stack.m_callbacks, first_non_whitespace <= r.len);
                    size_t last_newl = r.last_of('\n', first_non_whitespace);
                    size_t this_indentation = first_non_whitespace - last_newl - 1;
                    _c4dbgfbl("[{}]: #newlines={} firstnonws={} lastnewl={} this_indentation={} vs indentation={}", i, numnl_following, first_non_whitespace, last_newl, this_indentation, indentation);
                    _RYML_CB_ASSERT(m_stack.m_callbacks, first_non_whitespace >= last_newl + 1);
                    _RYML_CB_ASSERT(m_stack.m_callbacks, this_indentation >= indentation);
                    if(!started)
                    {
                        _c4dbgfbl("[{}]: #newlines={}. write all leading newlines", i, numnl_following);
                        for(size_t j = 0; j < 1 + numnl_following; ++j)
                            m_filter_arena.str[pos++] = '\n';
                        if(this_indentation > indentation)
                        {
                            is_indented = true;
                            _c4dbgfbl("[{}]: advance ->{}", i, last_newl + indentation);
                            i = last_newl + indentation;
                        }
                        else
                        {
                            i = first_non_whitespace - 1;
                            _c4dbgfbl("[{}]: advance ->{}", i, first_non_whitespace);
                        }
                    }
                    else if(this_indentation == indentation)
                    {
                        _c4dbgfbl("[{}]: same indentation", i);
                        if(!is_indented)
                        {
                            if(numnl_following == 0)
                            {
                                _c4dbgfbl("[{}]: fold!", i);
                                m_filter_arena.str[pos++] = ' ';
                            }
                            else
                            {
                                _c4dbgfbl("[{}]: add {} newlines", i, 1 + numnl_following);
                                for(size_t j = 0; j < numnl_following; ++j)
                                    m_filter_arena.str[pos++] = '\n';
                            }
                            i = first_non_whitespace - 1;
                            _c4dbgfbl("[{}]: advance {}->{}", i, i, first_non_whitespace);
                        }
                        else
                        {
                            _c4dbgfbl("[{}]: back to ref indentation", i);
                            is_indented = false;
                            on_change_indentation(numnl_following, last_newl, first_non_whitespace);
                            _c4dbgfbl("[{}]: advance {}->{}", i, i, first_non_whitespace);
                        }
                    }
                    else
                    {
                        _c4dbgfbl("[{}]: increased indentation.", i);
                        is_indented = true;
                        _RYML_CB_ASSERT(m_stack.m_callbacks, this_indentation > indentation);
                        on_change_indentation(numnl_following, last_newl, first_non_whitespace);
                        _c4dbgfbl("[{}]: advance {}->{}", i, i, first_non_whitespace);
                    }
                }
                else if(curr != '\r')
                {
                    if(curr != '\t')
                        started = true;
                    m_filter_arena.str[pos++] = curr;
                }
            }
            _RYML_CB_ASSERT(m_stack.m_callbacks, pos <= m_filter_arena.len);
            _c4dbgfbl(": #filteredchars={} after=[{}]~~~{}~~~", (int)s.len - (int)pos, pos, m_filter_arena.first(pos));
            bool changed = _apply_chomp(m_filter_arena, &pos, chomp);
            if(pos < r.len || filtered_chars || changed)
            {
                r = _finish_filter_arena(s, pos); // write into s
            }
        }
        break;
    default:
        _c4err("unknown block style");
    }

    _c4dbgfbl(": final=[{}]~~~{}~~~", r.len, r);

    #undef _c4dbgfbl

    return r;
}